

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O3

string * __thiscall
viface::utils::hexdump_abi_cxx11_
          (string *__return_storage_ptr__,utils *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  byte bVar1;
  char cVar2;
  string *psVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ostringstream buff;
  undefined1 auStack_1d8 [15];
  char local_1c9;
  long local_1c8;
  utils *local_1c0;
  string *local_1b8;
  ulong local_1b0;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  local_1b8 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1c8 = *(long *)(this + 8) - *(long *)this;
  local_1c0 = this;
  if (0 < (int)(uint)local_1c8) {
    uVar6 = (ulong)((uint)local_1c8 & 0x7fffffff);
    uVar10 = 0;
    do {
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x80;
      lVar8 = *(long *)(local_1a8[0] + -0x18);
      if (acStack_c8[lVar8 + 1] == '\0') {
        std::ios::widen((char)auStack_1d8 + (char)lVar8 + '0');
        acStack_c8[lVar8 + 1] = '\x01';
      }
      acStack_c8[lVar8] = '0';
      *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 4;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)uVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
      lVar8 = 0x10;
      local_1b0 = uVar10;
      do {
        lVar9 = 3;
        pcVar7 = "   ";
        if (uVar10 < uVar6) {
          bVar1 = *(byte *)(*(long *)local_1c0 + uVar10);
          lVar9 = *(long *)(local_1a8[0] + -0x18);
          if (acStack_c8[lVar9 + 1] == '\0') {
            std::ios::widen((char)auStack_1d8 + (char)lVar9 + '0');
            acStack_c8[lVar9 + 1] = '\x01';
          }
          acStack_c8[lVar9] = '0';
          *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
          lVar9 = 1;
          std::ostream::operator<<((ostream *)local_1a8,(uint)bVar1);
          pcVar7 = " ";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,lVar9);
        uVar10 = uVar10 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      uVar10 = local_1b0;
      lVar8 = 0x10;
      uVar11 = local_1b0;
      do {
        if (uVar11 < uVar6) {
          cVar2 = *(char *)(*(long *)local_1c0 + uVar11);
          iVar4 = isprint((int)cVar2);
          if (iVar4 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
          }
          else {
            local_1c9 = cVar2;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1c9,1);
          }
        }
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
      cVar2 = (char)(ostringstream *)local_1a8;
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      uVar10 = uVar10 + 0x10;
    } while ((int)uVar10 < (int)local_1c8);
  }
  psVar3 = local_1b8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

string hexdump(vector<uint8_t> const& bytes)
{
    ostringstream buff;

    int buflen = bytes.size();

    int i;
    int j;
    char c;

    for (i = 0, j = 0; i < buflen; i += 16) {
        // Print offset
        buff << right << setfill('0') << setw(4) << i << "  ";

        // Print bytes in hexadecimal
        buff << hex;
        for (j = 0; j < 16; j++) {
            if (i + j < buflen) {
                c = bytes[i + j];
                buff << setfill('0') << setw(2) << (int(c) & 0xFF);
                buff << " ";
            } else {
                buff << "   ";
            }
        }
        buff << dec;
        buff << " ";

        // Print printable characters
        for (j = 0; j < 16; j++) {
            if (i + j < buflen) {
                c = bytes[i + j];
                if (isprint(c)) {
                    buff << c;
                } else {
                    buff << ".";
                }
            }
        }
        buff << endl;
    }
    return buff.str();
}